

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O2

void __thiscall
QVariantAnimationPrivate::setCurrentValueForProgress(QVariantAnimationPrivate *this,qreal progress)

{
  QVariant *lhs;
  double dVar1;
  QObject *this_00;
  bool bVar2;
  QBasicAtomicInt QVar3;
  long in_FS_OFFSET;
  double dVar4;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  dVar1 = (this->currentInterval).start.first;
  dVar4 = progress - dVar1;
  local_48._16_4_ = 0xaaaaaaaa;
  local_48._20_4_ = 0xaaaaaaaa;
  uStack_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  local_48._0_4_ = 0xaaaaaaaa;
  local_48._4_4_ = 0xaaaaaaaa;
  local_48._8_4_ = 0xaaaaaaaa;
  local_48._12_4_ = 0xaaaaaaaa;
  (*this_00->_vptr_QObject[0x11])
            (~-(ulong)(dVar4 == 0.0) & (ulong)(dVar4 / ((this->currentInterval).end.first - dVar1)),
             &local_48,this_00,&(this->currentInterval).start.second,
             &(this->currentInterval).end.second);
  lhs = &this->currentValue;
  std::swap<QVariant::Private>(&lhs->d,(Private *)&local_48);
  (*this_00->_vptr_QObject[0x10])(this_00,lhs);
  if ((__atomic_base<int>)
      setCurrentValueForProgress::changedSignalIndex._q_value.super___atomic_base<int>._M_i ==
      (__atomic_base<int>)0x0) {
    QVar3._q_value.super___atomic_base<int>._M_i =
         (Type)QObjectPrivate::signalIndex
                         ((QObjectPrivate *)this,"valueChanged(QVariant)",(QMetaObject **)0x0);
    LOCK();
    if ((__atomic_base<int>)
        setCurrentValueForProgress::changedSignalIndex._q_value.super___atomic_base<int>._M_i !=
        (__atomic_base<int>)0x0) {
      QVar3 = setCurrentValueForProgress::changedSignalIndex;
    }
    setCurrentValueForProgress::changedSignalIndex._q_value.super___atomic_base<int>._M_i =
         QVar3._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  bVar2 = QObjectPrivate::isSignalConnected
                    ((QObjectPrivate *)this,
                     (uint)setCurrentValueForProgress::changedSignalIndex._q_value.
                           super___atomic_base<int>._M_i,true);
  if ((bVar2) && (bVar2 = ::operator!=(lhs,(QVariant *)&local_48), bVar2)) {
    QVariantAnimation::valueChanged((QVariantAnimation *)this_00,lhs);
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariantAnimationPrivate::setCurrentValueForProgress(const qreal progress)
{
    Q_Q(QVariantAnimation);

    const qreal startProgress = currentInterval.start.first;
    const qreal endProgress = currentInterval.end.first;
    const qreal localProgress =
            qIsNull(progress - startProgress) ? 0.0 // avoid 0/0 below
            /* else */                        : (progress - startProgress) / (endProgress - startProgress);

    QVariant ret = q->interpolated(currentInterval.start.second,
                                   currentInterval.end.second,
                                   localProgress);
    qSwap(currentValue, ret);
    q->updateCurrentValue(currentValue);
    Q_CONSTINIT static QBasicAtomicInt changedSignalIndex = Q_BASIC_ATOMIC_INITIALIZER(0);
    if (!changedSignalIndex.loadRelaxed()) {
        //we keep the mask so that we emit valueChanged only when needed (for performance reasons)
        changedSignalIndex.testAndSetRelaxed(0, signalIndex("valueChanged(QVariant)"));
    }
    if (isSignalConnected(changedSignalIndex.loadRelaxed()) && currentValue != ret) {
        //the value has changed
        emit q->valueChanged(currentValue);
    }
}